

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::SstReader::DoGetSync(SstReader *this,Variable<double> *variable,double *data)

{
  unsigned_long *Data;
  double *in_RSI;
  Variable<double> *in_RDI;
  SstReader *unaff_retaddr;
  int NeedSync;
  size_t DimCount;
  size_t *Count;
  size_t *Start;
  SstStream in_stack_fffffffffffffed0;
  allocator *in_stack_fffffffffffffef0;
  allocator *in_stack_fffffffffffffef8;
  int BlockID;
  allocator *in_stack_ffffffffffffff00;
  allocator *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar1;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  void *Data_00;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [40];
  Variable<double> *variable_00;
  
  variable_00 = in_RDI;
  if (((ulong)(in_RDI->super_VariableBase).m_Start.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 0x100000000) == 0) {
    in_stack_ffffffffffffff08 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Engine",in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff00 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"SstReader",in_stack_ffffffffffffff00);
    in_stack_fffffffffffffef8 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"DoGetSync",in_stack_fffffffffffffef8);
    in_stack_fffffffffffffef0 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,
               "When using the SST engine in ADIOS2, Get() calls must appear between BeginStep/EndStep pairs"
               ,in_stack_fffffffffffffef0);
    helper::Throw<std::logic_error>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (int)((ulong)in_RDI >> 0x20));
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if (*(int *)&(in_RDI->super_VariableBase).m_MemoryCount.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage == 0) {
    Data_00 = (void *)0x0;
    iVar1 = 0;
    if (*(int *)(in_RSI + 10) == 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xb));
      Data = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xe77283);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xe7729c);
      std::__cxx11::string::c_str();
      iVar1 = SstFFSGetDeferred((SstStream)CONCAT44(iVar1,in_stack_ffffffffffffff18),in_RDI,
                                (char *)in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00,
                                (size_t *)in_stack_fffffffffffffef8,
                                (size_t *)in_stack_fffffffffffffef0,Data);
    }
    else if (*(int *)(in_RSI + 10) == 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0x11));
      BlockID = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xe77348);
      in_stack_fffffffffffffed0 =
           (SstStream)
           (in_RDI->super_VariableBase).m_MemoryCount.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      std::__cxx11::string::c_str();
      iVar1 = SstFFSGetLocalDeferred
                        ((SstStream)CONCAT44(iVar1,in_stack_ffffffffffffff18),in_RDI,
                         (char *)in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00,BlockID
                         ,(size_t *)in_stack_fffffffffffffef0,Data_00);
    }
    if (iVar1 != 0) {
      SstFFSPerformGets(in_stack_fffffffffffffed0);
    }
  }
  if (((*(int *)&(in_RDI->super_VariableBase).m_MemoryCount.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage == 1) ||
      (*(int *)&(in_RDI->super_VariableBase).m_MemoryCount.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == 2)) &&
     (DoGetDeferred(unaff_retaddr,variable_00,in_RSI), (*(byte *)((long)in_RSI + 0x54) & 1) == 0)) {
    (*(in_RDI->super_VariableBase)._vptr_VariableBase[7])();
  }
  return;
}

Assistant:

void SstReader::DoGetStructSync(VariableStruct &variable, void *data)
{
    PERFSTUBS_SCOPED_TIMER("BP5Reader::Get");
    if (m_WriterMarshalMethod != SstMarshalBP5)
    {
        helper::Throw<std::runtime_error>(
            "Engine", "SstReader", "GetStructSync",
            "SST only supports struct transmission when BP5 marshalling is "
            "selected");
    }
    bool need_sync = m_BP5Deserializer->QueueGet(variable, data);
    if (need_sync)
        BP5PerformGets();
}